

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_config.cc
# Opt level: O1

void __thiscall
absl::lts_20240722::flags_internal::ReportUsageError
          (flags_internal *this,string_view msg,bool is_fatal)

{
  ostream *poVar1;
  string_view sVar2;
  
  sVar2._M_str = (char *)msg._M_len;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,sVar2._M_str,(long)this);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((int)msg._M_str != 0) {
    sVar2._M_len = (size_t)this;
    AbslInternalReportFatalUsageError_lts_20240722(sVar2);
    return;
  }
  return;
}

Assistant:

void ReportUsageError(absl::string_view msg, bool is_fatal) {
  std::cerr << "ERROR: " << msg << std::endl;

  if (is_fatal) {
    ABSL_INTERNAL_C_SYMBOL(AbslInternalReportFatalUsageError)(msg);
  }
}